

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_storage.cpp
# Opt level: O1

void __thiscall
duckdb::InMemoryLogStorage::WriteLogEntry
          (InMemoryLogStorage *this,timestamp_t timestamp,LogLevel level,string *log_type,
          string *log_message,RegisteredLoggingContext *context)

{
  unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true> *this_00;
  idx_t iVar1;
  data_ptr_t pdVar2;
  data_ptr_t pdVar3;
  data_ptr_t pdVar4;
  string *data;
  __node_base_ptr p_Var5;
  pointer pDVar6;
  reference pvVar7;
  char *pcVar8;
  undefined7 in_register_00000011;
  long lVar9;
  string_t sVar10;
  unique_lock<std::mutex> lck;
  allocator local_95;
  undefined4 local_94;
  InMemoryLogStorage *local_90;
  data_ptr_t local_88;
  string *local_80;
  data_ptr_t local_78;
  string *local_70;
  int64_t local_68;
  unique_lock<std::mutex> local_60;
  string local_50;
  
  local_60._M_device = &this->lock;
  local_60._M_owns = false;
  local_68 = timestamp.value;
  ::std::unique_lock<std::mutex>::lock(&local_60);
  local_60._M_owns = true;
  p_Var5 = ::std::
           _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
           ::_M_find_before_node
                     (&(this->registered_contexts)._M_h,
                      context->context_id % (this->registered_contexts)._M_h._M_bucket_count,
                      &context->context_id,context->context_id);
  if ((p_Var5 == (__node_base_ptr)0x0) || (p_Var5->_M_nxt == (_Hash_node_base *)0x0)) {
    WriteLoggingContext(this,context);
  }
  this_00 = &this->entry_buffer;
  local_90 = this;
  local_70 = log_type;
  pDVar6 = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::operator->
                     (this_00);
  iVar1 = pDVar6->count;
  pDVar6 = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::operator->
                     (this_00);
  pvVar7 = vector<duckdb::Vector,_true>::operator[](&pDVar6->data,0);
  local_78 = pvVar7->data;
  pDVar6 = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::operator->
                     (this_00);
  pvVar7 = vector<duckdb::Vector,_true>::operator[](&pDVar6->data,1);
  pdVar2 = pvVar7->data;
  pDVar6 = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::operator->
                     (this_00);
  pvVar7 = vector<duckdb::Vector,_true>::operator[](&pDVar6->data,2);
  local_94 = (undefined4)CONCAT71(in_register_00000011,level);
  pdVar3 = pvVar7->data;
  local_80 = log_message;
  pDVar6 = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::operator->
                     (this_00);
  pvVar7 = vector<duckdb::Vector,_true>::operator[](&pDVar6->data,3);
  pdVar4 = pvVar7->data;
  pDVar6 = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::operator->
                     (this_00);
  pvVar7 = vector<duckdb::Vector,_true>::operator[](&pDVar6->data,4);
  local_88 = pvVar7->data;
  *(idx_t *)(local_78 + iVar1 * 8) = context->context_id;
  *(int64_t *)(pdVar2 + iVar1 * 8) = local_68;
  pDVar6 = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::operator->
                     (this_00);
  pvVar7 = vector<duckdb::Vector,_true>::operator[](&pDVar6->data,2);
  sVar10 = StringVector::AddString(pvVar7,local_70);
  lVar9 = iVar1 * 0x10;
  *(long *)(pdVar3 + lVar9) = sVar10.value._0_8_;
  *(long *)(pdVar3 + lVar9 + 8) = sVar10.value._8_8_;
  pDVar6 = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::operator->
                     (this_00);
  pvVar7 = vector<duckdb::Vector,_true>::operator[](&pDVar6->data,3);
  pcVar8 = EnumUtil::ToChars<duckdb::LogLevel>((LogLevel)local_94);
  ::std::__cxx11::string::string((string *)&local_50,pcVar8,&local_95);
  sVar10 = StringVector::AddString(pvVar7,&local_50);
  *(long *)(pdVar4 + lVar9) = sVar10.value._0_8_;
  *(long *)(pdVar4 + lVar9 + 8) = sVar10.value._8_8_;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  pDVar6 = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::operator->
                     (this_00);
  data = local_80;
  pvVar7 = vector<duckdb::Vector,_true>::operator[](&pDVar6->data,4);
  sVar10 = StringVector::AddString(pvVar7,data);
  *(long *)(local_88 + lVar9) = sVar10.value._0_8_;
  *(long *)(local_88 + lVar9 + 8) = sVar10.value._8_8_;
  pDVar6 = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::operator->
                     (this_00);
  pDVar6->count = iVar1 + 1;
  if (local_90->max_buffer_size <= iVar1 + 1) {
    FlushInternal(local_90);
  }
  ::std::unique_lock<std::mutex>::~unique_lock(&local_60);
  return;
}

Assistant:

void InMemoryLogStorage::WriteLogEntry(timestamp_t timestamp, LogLevel level, const string &log_type,
                                       const string &log_message, const RegisteredLoggingContext &context) {
	unique_lock<mutex> lck(lock);

	if (registered_contexts.find(context.context_id) == registered_contexts.end()) {
		WriteLoggingContext(context);
	}

	auto size = entry_buffer->size();
	auto context_id_data = FlatVector::GetData<idx_t>(entry_buffer->data[0]);
	auto timestamp_data = FlatVector::GetData<timestamp_t>(entry_buffer->data[1]);
	auto type_data = FlatVector::GetData<string_t>(entry_buffer->data[2]);
	auto level_data = FlatVector::GetData<string_t>(entry_buffer->data[3]);
	auto message_data = FlatVector::GetData<string_t>(entry_buffer->data[4]);

	context_id_data[size] = context.context_id;
	timestamp_data[size] = timestamp;
	type_data[size] = StringVector::AddString(entry_buffer->data[2], log_type);
	level_data[size] = StringVector::AddString(entry_buffer->data[3], EnumUtil::ToString(level));
	message_data[size] = StringVector::AddString(entry_buffer->data[4], log_message);

	entry_buffer->SetCardinality(size + 1);

	if (size + 1 >= max_buffer_size) {
		FlushInternal();
	}
}